

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  string *__rhs;
  pointer *pppAVar1;
  _Alloc_hider _Var2;
  iterator __position;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  App *pAVar6;
  Option *this_00;
  ConfigError *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  pointer pbVar7;
  string res;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar7 = (item->parents).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (level < (ulong)((long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)) {
    _Var2._M_p = pbVar7[level]._M_dataplus._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,_Var2._M_p,_Var2._M_p + pbVar7[level]._M_string_length);
    pAVar6 = get_subcommand(this,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    bVar4 = _parse_single_config(pAVar6,item,level + 1);
  }
  else {
    __rhs = &item->name;
    iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
    if (iVar5 == 0) {
      bVar4 = true;
      if (this->configurable_ == true) {
        increment_parsed(this);
        _trigger_pre_parse(this,2);
        pAVar6 = this->parent_;
        if (pAVar6 != (App *)0x0) {
          __position._M_current =
               (pAVar6->parsed_subcommands_).
               super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pAVar6->parsed_subcommands_).
              super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_128._M_dataplus._M_p = (pointer)this;
            ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*>
                      ((vector<CLI::App*,std::allocator<CLI::App*>> *)&pAVar6->parsed_subcommands_,
                       __position,(App **)&local_128);
          }
          else {
            *__position._M_current = this;
            pppAVar1 = &(pAVar6->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppAVar1 = *pppAVar1 + 1;
          }
        }
      }
    }
    else {
      iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
      if (iVar5 == 0) {
        bVar4 = true;
        if (this->configurable_ == true) {
          _process_callbacks(this);
          _process_requirements(this);
          run_callback(this,false);
        }
      }
      else {
        ::std::operator+(&local_50,"--",__rhs);
        this_00 = get_option_no_throw(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (this_00 == (Option *)0x0) {
          if (this->allow_config_extras_ == capture) {
            local_90._M_dataplus._M_p._0_4_ = 0;
            ConfigItem::fullname_abi_cxx11_(&local_128,item);
            ::std::
            vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
            ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                      ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                        *)&this->missing_,(Classifier *)&local_90,&local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
          }
          bVar4 = false;
        }
        else {
          if ((this_00->super_OptionBase<CLI::Option>).configurable_ == false) {
            __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
            ConfigItem::fullname_abi_cxx11_(&local_70,item);
            ConfigError::NotConfigurable(__return_storage_ptr__,&local_70);
            __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
          }
          bVar4 = true;
          if ((this_00->results_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this_00->results_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if (this_00->expected_min_ == 0) {
              peVar3 = (this->config_formatter_).
                       super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (*peVar3->_vptr_Config[2])(&local_128,peVar3,item);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,local_128._M_dataplus._M_p,
                         local_128._M_dataplus._M_p + local_128._M_string_length);
              Option::get_flag_value(&local_90,this_00,__rhs,&local_e8);
              ::std::__cxx11::string::operator=((string *)&local_128,(string *)&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_) !=
                  &local_90.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                         local_90._M_dataplus._M_p._0_4_));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_108,local_128._M_dataplus._M_p,
                         local_128._M_dataplus._M_p + local_128._M_string_length);
              Option::_add_result(this_00,&local_108,&this_00->results_);
              this_00->current_option_state_ = parsing;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p);
              }
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_a8,&item->inputs);
              for (pbVar7 = local_a8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar7 != local_a8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
                Option::_add_result(this_00,pbVar7,&this_00->results_);
              }
              this_00->current_option_state_ = parsing;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_a8);
              Option::run_callback(this_00);
            }
          }
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool _parse_single_config(const ConfigItem &item, std::size_t level = 0) {
        if(level < item.parents.size()) {
            try {
                auto subcom = get_subcommand(item.parents.at(level));
                auto result = subcom->_parse_single_config(item, level + 1);

                return result;
            } catch(const OptionNotFound &) {
                return false;
            }
        }
        // check for section open
        if(item.name == "++") {
            if(configurable_) {
                increment_parsed();
                _trigger_pre_parse(2);
                if(parent_ != nullptr) {
                    parent_->parsed_subcommands_.push_back(this);
                }
            }
            return true;
        }
        // check for section close
        if(item.name == "--") {
            if(configurable_) {
                _process_callbacks();
                _process_requirements();
                run_callback();
            }
            return true;
        }
        Option *op = get_option_no_throw("--" + item.name);
        if(op == nullptr) {
            // If the option was not present
            if(get_allow_config_extras() == config_extras_mode::capture)
                // Should we worry about classifying the extras properly?
                missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            return false;
        }

        if(!op->get_configurable())
            throw ConfigError::NotConfigurable(item.fullname());

        if(op->empty()) {
            // Flag parsing
            if(op->get_expected_min() == 0) {
                auto res = config_formatter_->to_flag(item);
                res = op->get_flag_value(item.name, res);

                op->add_result(res);

            } else {
                op->add_result(item.inputs);
                op->run_callback();
            }
        }

        return true;
    }